

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::BufferTfOutputAttacher::setupContainer
          (BufferTfOutputAttacher *this,GLuint seed,GLuint tf)

{
  ScaleProgram *pSVar1;
  undefined4 seed_00;
  deUint32 dVar2;
  deUint32 vao_00;
  GLenum err;
  RenderContext *pRVar3;
  Functions *pFVar4;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  ContextWrapper *this_01;
  double __x;
  MessageBuilder local_1d8;
  undefined1 local_48 [8];
  VertexArray vao;
  Buffer posBuf;
  GLuint tf_local;
  GLuint seed_local;
  BufferTfOutputAttacher *this_local;
  
  this_01 = &(this->super_OutputAttacher).super_ContextWrapper;
  posBuf.super_ObjectWrapper.m_object = tf;
  posBuf.super_ObjectWrapper._20_4_ = seed;
  pRVar3 = deqp::gls::LifetimeTests::details::ContextWrapper::getRenderContext(this_01);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&vao.super_ObjectWrapper.m_object,pRVar3);
  pRVar3 = deqp::gls::LifetimeTests::details::ContextWrapper::getRenderContext(this_01);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_48,pRVar3);
  pFVar4 = deqp::gls::LifetimeTests::details::ContextWrapper::gl
                     (&(this->super_OutputAttacher).super_ContextWrapper);
  seed_00 = posBuf.super_ObjectWrapper._20_4_;
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&vao.super_ObjectWrapper.m_object);
  initBuffer(pFVar4,seed_00,0x88e4,dVar2);
  pSVar1 = this->m_program;
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&vao.super_ObjectWrapper.m_object);
  vao_00 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  ScaleProgram::setPos(pSVar1,dVar2,vao_00);
  glu::CallLogWrapper::glBindTransformFeedback
            (&(this->super_OutputAttacher).super_ContextWrapper.super_CallLogWrapper,0x8e22,
             posBuf.super_ObjectWrapper.m_object);
  pSVar1 = this->m_program;
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  ScaleProgram::draw(pSVar1,dVar2,-1.0,true,(Surface *)0x0);
  deqp::gls::LifetimeTests::details::ContextWrapper::log
            (&(this->super_OutputAttacher).super_ContextWrapper,__x);
  tcu::TestLog::operator<<(&local_1d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [28])"// Drew an image with seed ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)&posBuf.super_ObjectWrapper.field_0x14);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [29])" with transform feedback to ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&posBuf.super_ObjectWrapper.m_object);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d8);
  glu::CallLogWrapper::glBindTransformFeedback
            (&(this->super_OutputAttacher).super_ContextWrapper.super_CallLogWrapper,0x8e22,0);
  pFVar4 = deqp::gls::LifetimeTests::details::ContextWrapper::gl
                     (&(this->super_OutputAttacher).super_ContextWrapper);
  err = (*pFVar4->getError)();
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                  ,0x188);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_48);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&vao.super_ObjectWrapper.m_object);
  return;
}

Assistant:

void BufferTfOutputAttacher::setupContainer (GLuint seed, GLuint tf)
{
	Buffer		posBuf	(getRenderContext());
	VertexArray	vao		(getRenderContext());

	initBuffer(gl(), seed, GL_STATIC_DRAW, *posBuf);
	m_program.setPos(*posBuf, *vao);

	glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, tf);
	m_program.draw(*vao, -1.0, true, DE_NULL);
	log() << TestLog::Message
		  << "// Drew an image with seed " << seed << " with transform feedback to " << tf
		  << TestLog::EndMessage;
	glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
	GLU_CHECK_ERROR(gl().getError());
}